

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O1

void upd7759_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  upd7759_state *chip;
  
  uVar1 = *(uint *)((long)info + 0x44);
  if (uVar1 < offset) {
    return;
  }
  __n = (ulong)(uVar1 - offset);
  if (length + offset <= uVar1) {
    __n = (ulong)length;
  }
  memcpy((void *)((ulong)offset + *(long *)((long)info + 0x50)),data,__n);
  return;
}

Assistant:

static void upd7759_write_rom(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	upd7759_state *chip = (upd7759_state *)info;
	
	if (offset > chip->romsize)
		return;
	if (offset + length > chip->romsize)
		length = chip->romsize - offset;
	
	memcpy(chip->rombase + offset, data, length);
	
	return;
}